

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O1

void __thiscall InterpTest_Fac_Test::~InterpTest_Fac_Test(InterpTest_Fac_Test *this)

{
  InterpTest::~InterpTest(&this->super_InterpTest);
  operator_delete(this,0x240);
  return;
}

Assistant:

TEST_F(InterpTest, Fac) {
  ReadModule(s_fac_module);
  Instantiate();
  auto func = GetFuncExport(0);

  Values results;
  Trap::Ptr trap;
  Result result = func->Call(store_, {Value::Make(5)}, results, &trap);

  ASSERT_EQ(Result::Ok, result);
  EXPECT_EQ(1u, results.size());
  EXPECT_EQ(120u, results[0].Get<u32>());
}